

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int isUnsupportedTerm(void)

{
  int iVar1;
  char *__s1;
  int local_1c;
  int j;
  char *term;
  
  __s1 = getenv("TERM");
  if (__s1 != (char *)0x0) {
    for (local_1c = 0; unsupported_term[local_1c] != (char *)0x0; local_1c = local_1c + 1) {
      iVar1 = strcasecmp(__s1,unsupported_term[local_1c]);
      if (iVar1 == 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int isUnsupportedTerm(void) {
    char *term = getenv("TERM");
    int j;

    if (term == NULL) return 0;
    for (j = 0; unsupported_term[j]; j++)
        if (!strcasecmp(term,unsupported_term[j])) return 1;
    return 0;
}